

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

property_ptr __thiscall
dtc::fdt::device_tree::assign_phandle(device_tree *this,node_ptr *n,uint32_t *phandle)

{
  uint val;
  bool bVar1;
  element_type *peVar2;
  property *ppVar3;
  element_type *peVar4;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  property_ptr pVar6;
  property_value local_2d0;
  undefined1 local_269;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  allocator<char> local_221;
  string local_220;
  property_value local_200;
  undefined1 local_199;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  allocator<char> local_151;
  string local_150;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_false>
  local_130;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_false>
  local_128;
  string local_120;
  undefined1 local_100 [8];
  property_value v;
  string local_98 [32];
  undefined1 local_78 [40];
  string local_50 [48];
  uint32_t *phandle_local;
  node_ptr *n_local;
  device_tree *this_local;
  property_ptr *p;
  
  local_50[0x27] = (string)0x0;
  local_50._40_8_ = in_RCX;
  phandle_local = phandle;
  n_local = n;
  this_local = this;
  peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)phandle);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"phandle",(allocator<char> *)(local_78 + 0x27));
  node::get_property((node *)this,(string *)peVar2);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x27));
  bVar1 = std::operator==((shared_ptr<dtc::fdt::property> *)this,(nullptr_t)0x0);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)phandle);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,"linux,phandle",(allocator<char> *)&v.field_0x5f);
    node::get_property((node *)local_78,(string *)peVar2);
    std::shared_ptr<dtc::fdt::property>::operator=
              ((shared_ptr<dtc::fdt::property> *)this,(shared_ptr<dtc::fdt::property> *)local_78);
    std::shared_ptr<dtc::fdt::property>::~shared_ptr((shared_ptr<dtc::fdt::property> *)local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&v.field_0x5f);
  }
  bVar1 = std::operator==((shared_ptr<dtc::fdt::property> *)this,(nullptr_t)0x0);
  _Var5._M_pi = extraout_RDX;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_120);
    property_value::property_value((property_value *)local_100,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    while( true ) {
      local_128._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::shared_ptr<dtc::fdt::node>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>_>
           ::find((unordered_map<unsigned_int,_std::shared_ptr<dtc::fdt::node>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>_>
                   *)(n + 0x1a),(key_type *)local_50._40_8_);
      local_130._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::shared_ptr<dtc::fdt::node>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>_>
           ::end((unordered_map<unsigned_int,_std::shared_ptr<dtc::fdt::node>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>_>
                  *)(n + 0x1a));
      bVar1 = std::__detail::operator!=(&local_128,&local_130);
      if (!bVar1) break;
      *(uint *)local_50._40_8_ = *(uint *)local_50._40_8_ + 1;
    }
    val = *(uint *)local_50._40_8_;
    *(uint *)local_50._40_8_ = val + 1;
    push_big_endian<unsigned_int>((byte_buffer *)((long)&v.string_data.field_2 + 8),val);
    if ((*(int *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 2)
       || (*(int *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 0)
       ) {
      ppVar3 = (property *)operator_new(0x78);
      local_199 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"linux,phandle",&local_151);
      local_198._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      local_198._M_h._M_rehash_policy._4_4_ = 0;
      local_198._M_h._M_rehash_policy._M_next_resize = 0;
      local_198._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_198._M_h._M_element_count = 0;
      local_198._M_h._M_buckets = (__buckets_ptr)0x0;
      local_198._M_h._M_bucket_count = 0;
      local_198._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&local_198);
      property::property(ppVar3,&local_150,&local_198);
      local_199 = 0;
      std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar3);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set(&local_198);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      peVar4 = std::
               __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      property_value::property_value(&local_200,(property_value *)local_100);
      property::add_value(peVar4,&local_200);
      property_value::~property_value(&local_200);
      peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)phandle);
      node::add_property(peVar2,(property_ptr *)this);
    }
    if ((*(int *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 2)
       || (*(int *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == 1)
       ) {
      ppVar3 = (property *)operator_new(0x78);
      local_269 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"phandle",&local_221);
      local_268._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      local_268._M_h._M_rehash_policy._4_4_ = 0;
      local_268._M_h._M_rehash_policy._M_next_resize = 0;
      local_268._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268._M_h._M_element_count = 0;
      local_268._M_h._M_buckets = (__buckets_ptr)0x0;
      local_268._M_h._M_bucket_count = 0;
      local_268._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&local_268);
      property::property(ppVar3,&local_220,&local_268);
      local_269 = 0;
      std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar3);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set(&local_268);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      peVar4 = std::
               __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      property_value::property_value(&local_2d0,(property_value *)local_100);
      property::add_value(peVar4,&local_2d0);
      property_value::~property_value(&local_2d0);
      peVar2 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)phandle);
      node::add_property(peVar2,(property_ptr *)this);
    }
    property_value::~property_value((property_value *)local_100);
    _Var5._M_pi = extraout_RDX_00;
  }
  pVar6.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar6.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (property_ptr)pVar6.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
device_tree::assign_phandle(node_ptr n, uint32_t &phandle)
{
	// If there is an existing phandle, use it
	property_ptr p = n->get_property("phandle");
	if (p == 0)
	{
		p = n->get_property("linux,phandle");
	}
	if (p == 0)
	{
		// Otherwise insert a new phandle node
		property_value v;
		while (used_phandles.find(phandle) != used_phandles.end())
		{
			// Note that we only don't need to
			// store this phandle in the set,
			// because we are monotonically
			// increasing the value of phandle and
			// so will only ever revisit this value
			// if we have used 2^32 phandles, at
			// which point our blob won't fit in
			// any 32-bit system and we've done
			// something badly wrong elsewhere
			// already.
			phandle++;
		}
		push_big_endian(v.byte_data, phandle++);
		if (phandle_node_name == BOTH || phandle_node_name == LINUX)
		{
			p.reset(new property("linux,phandle"));
			p->add_value(v);
			n->add_property(p);
		}
		if (phandle_node_name == BOTH || phandle_node_name == EPAPR)
		{
			p.reset(new property("phandle"));
			p->add_value(v);
			n->add_property(p);
		}
	}

	return (p);
}